

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

bool __thiscall google::protobuf::io::Tokenizer::TryConsumeWhitespace(Tokenizer *this)

{
  bool bVar1;
  Tokenizer *this_local;
  
  if ((this->report_newlines_ & 1U) == 0) {
    bVar1 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::Whitespace>(this);
    if (bVar1) {
      ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::Whitespace>(this);
      (this->current_).type = TYPE_WHITESPACE;
      this_local._7_1_ = (bool)(this->report_whitespace_ & 1);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    bVar1 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::WhitespaceNoNewline>(this);
    if (bVar1) {
      ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::WhitespaceNoNewline>(this);
      (this->current_).type = TYPE_WHITESPACE;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Tokenizer::TryConsumeWhitespace() {
  if (report_newlines_) {
    if (TryConsumeOne<WhitespaceNoNewline>()) {
      ConsumeZeroOrMore<WhitespaceNoNewline>();
      current_.type = TYPE_WHITESPACE;
      return true;
    }
    return false;
  }
  if (TryConsumeOne<Whitespace>()) {
    ConsumeZeroOrMore<Whitespace>();
    current_.type = TYPE_WHITESPACE;
    return report_whitespace_;
  }
  return false;
}